

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_1_1_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  float *pfVar23;
  int iVar24;
  float *data;
  ulong uVar25;
  int k_count;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  float *pfVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  int k_count_1;
  float *pfVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  float fVar56;
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  undefined1 in_ZMM8 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  int l0_1;
  int data_width;
  int l_count0_1;
  int l0;
  int l_count0;
  
  auVar50._8_4_ = 0x80000000;
  auVar50._0_8_ = 0x8000000080000000;
  auVar50._12_4_ = 0x80000000;
  auVar51._8_4_ = 0x3effffff;
  auVar51._0_8_ = 0x3effffff3effffff;
  auVar51._12_4_ = 0x3effffff;
  fVar57 = ipoint->scale;
  auVar69 = ZEXT464((uint)fVar57);
  auVar43 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)fVar57),auVar50,0xf8);
  auVar43 = ZEXT416((uint)(fVar57 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  iVar40 = (int)auVar43._0_4_;
  fVar56 = -0.08 / (fVar57 * fVar57);
  auVar44 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)ipoint->x),auVar50,0xf8);
  auVar44 = ZEXT416((uint)(ipoint->x + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45._0_8_ = (double)auVar44._0_4_;
  auVar45._8_8_ = auVar44._8_8_;
  auVar49._0_8_ = (double)fVar57;
  auVar49._8_8_ = 0;
  auVar44 = vfmadd231sd_fma(auVar45,auVar49,ZEXT816(0x3fe0000000000000));
  auVar48._0_4_ = (float)auVar44._0_8_;
  auVar48._4_12_ = auVar44._4_12_;
  auVar44 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)ipoint->y),auVar50,0xf8);
  auVar44 = ZEXT416((uint)(ipoint->y + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar46._0_8_ = (double)auVar44._0_4_;
  auVar46._8_8_ = auVar44._8_8_;
  auVar44 = vfmadd231sd_fma(auVar46,auVar49,ZEXT816(0x3fe0000000000000));
  auVar47._0_4_ = (float)auVar44._0_8_;
  auVar47._4_12_ = auVar44._4_12_;
  auVar44._0_4_ = (int)auVar43._0_4_;
  auVar44._4_4_ = (int)auVar43._4_4_;
  auVar44._8_4_ = (int)auVar43._8_4_;
  auVar44._12_4_ = (int)auVar43._12_4_;
  auVar43 = vcvtdq2ps_avx(auVar44);
  fVar2 = auVar48._0_4_ - auVar43._0_4_;
  fVar3 = auVar47._0_4_ - auVar43._0_4_;
  auVar43 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar57),auVar48);
  auVar44 = vpternlogd_avx512vl(auVar51,auVar43,auVar50,0xf8);
  auVar43 = ZEXT416((uint)(auVar43._0_4_ + auVar44._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = ZEXT416((uint)fVar57);
  if (iVar40 < (int)auVar43._0_4_) {
    auVar43 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar44,auVar47);
    auVar52._8_4_ = 0x3effffff;
    auVar52._0_8_ = 0x3effffff3effffff;
    auVar52._12_4_ = 0x3effffff;
    auVar53._8_4_ = 0x80000000;
    auVar53._0_8_ = 0x8000000080000000;
    auVar53._12_4_ = 0x80000000;
    auVar45 = vpternlogd_avx512vl(auVar53,auVar43,auVar52,0xea);
    auVar43 = ZEXT416((uint)(auVar43._0_4_ + auVar45._0_4_));
    auVar43 = vroundss_avx(auVar43,auVar43,0xb);
    if (iVar40 < (int)auVar43._0_4_) {
      auVar43 = vfmadd231ss_fma(auVar48,auVar44,ZEXT416(0x41300000));
      auVar54._8_4_ = 0x80000000;
      auVar54._0_8_ = 0x8000000080000000;
      auVar54._12_4_ = 0x80000000;
      auVar45 = vpternlogd_avx512vl(auVar54,auVar43,auVar52,0xea);
      auVar43 = ZEXT416((uint)(auVar43._0_4_ + auVar45._0_4_));
      auVar43 = vroundss_avx(auVar43,auVar43,0xb);
      if ((int)auVar43._0_4_ + iVar40 <= iimage->width) {
        auVar43 = vfmadd231ss_fma(auVar47,auVar44,ZEXT416(0x41300000));
        auVar15._8_4_ = 0x80000000;
        auVar15._0_8_ = 0x8000000080000000;
        auVar15._12_4_ = 0x80000000;
        auVar45 = vpternlogd_avx512vl(auVar52,auVar43,auVar15,0xf8);
        auVar43 = ZEXT416((uint)(auVar43._0_4_ + auVar45._0_4_));
        auVar43 = vroundss_avx(auVar43,auVar43,0xb);
        if ((int)auVar43._0_4_ + iVar40 <= iimage->height) {
          pfVar33 = iimage->data;
          iVar1 = iimage->data_width;
          iVar17 = -0xc;
          lVar20 = 0;
          pfVar42 = haarResponseX;
          pfVar23 = haarResponseY;
          do {
            auVar43._0_4_ = (float)iVar17;
            auVar43._4_12_ = in_ZMM8._4_12_;
            auVar43 = vfmadd213ss_fma(auVar43,auVar44,ZEXT416((uint)(fVar3 + 0.5)));
            iVar37 = (int)auVar43._0_4_;
            iVar24 = (iVar37 + -1) * iVar1;
            iVar18 = (iVar37 + -1 + iVar40) * iVar1;
            iVar37 = (iVar37 + -1 + iVar40 * 2) * iVar1;
            lVar28 = 0;
            do {
              auVar64._0_4_ = (float)((int)lVar28 + -0xc);
              auVar64._4_12_ = in_ZMM8._4_12_;
              auVar43 = vfmadd213ss_fma(auVar64,auVar44,ZEXT416((uint)(fVar2 + 0.5)));
              iVar35 = (int)auVar43._0_4_;
              iVar30 = iVar35 + -1 + iVar40;
              iVar31 = iVar35 + -1 + iVar40 * 2;
              fVar57 = pfVar33[iVar18 + -1 + iVar35];
              fVar4 = pfVar33[iVar37 + -1 + iVar35];
              fVar5 = pfVar33[iVar31 + iVar37];
              fVar6 = pfVar33[iVar24 + -1 + iVar35];
              fVar7 = pfVar33[iVar24 + iVar31];
              auVar43 = vfmadd213ss_fma(ZEXT416((uint)(pfVar33[iVar24 + iVar30] -
                                                      pfVar33[iVar30 + iVar37])),
                                        SUB6416(ZEXT464(0x40000000),0),
                                        ZEXT416((uint)(fVar5 - fVar6)));
              fVar61 = pfVar33[iVar18 + iVar31];
              pfVar42[lVar28] = (fVar4 - fVar7) + auVar43._0_4_;
              auVar43 = vfmadd213ss_fma(ZEXT416((uint)(fVar57 - fVar61)),
                                        SUB6416(ZEXT464(0x40000000),0),
                                        ZEXT416((uint)(fVar5 - fVar6)));
              pfVar23[lVar28] = auVar43._0_4_ - (fVar4 - fVar7);
              lVar28 = lVar28 + 1;
            } while (lVar28 != 0x18);
            iVar17 = iVar17 + 1;
            lVar20 = lVar20 + 1;
            pfVar23 = pfVar23 + 0x18;
            pfVar42 = pfVar42 + 0x18;
          } while (lVar20 != 0x18);
          goto LAB_0019f026;
        }
      }
    }
  }
  iVar1 = iVar40 * 2;
  iVar17 = -0xc;
  lVar28 = 0;
  lVar20 = 0;
  do {
    auVar58._0_4_ = (float)iVar17;
    auVar58._4_12_ = in_ZMM8._4_12_;
    auVar43 = vfmadd213ss_fma(auVar58,auVar69._0_16_,ZEXT416((uint)fVar3));
    fVar57 = auVar43._0_4_;
    iVar37 = (int)((double)((ulong)(0.0 <= fVar57) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar57) * -0x4020000000000000) + (double)fVar57);
    lVar26 = 0;
    lVar27 = lVar28;
    do {
      auVar59._0_4_ = (float)((int)lVar26 + -0xc);
      auVar59._4_12_ = in_ZMM8._4_12_;
      auVar43 = vfmadd213ss_fma(auVar59,auVar69._0_16_,ZEXT416((uint)fVar2));
      fVar57 = auVar43._0_4_;
      pfVar33 = (float *)((long)haarResponseY + lVar27);
      iVar24 = (int)((double)((ulong)(0.0 <= fVar57) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar57) * -0x4020000000000000) + (double)fVar57);
      if ((((iVar37 < 1) || (iVar24 < 1)) || (iimage->height < iVar1 + iVar37)) ||
         (iVar18 = iVar1 + iVar24, iimage->width < iVar18)) {
        haarXY(iimage,iVar37,iVar24,iVar40,(float *)((long)haarResponseX + lVar27),pfVar33);
        auVar69 = ZEXT1664(auVar44);
      }
      else {
        iVar30 = iVar24 + -1 + iVar40;
        pfVar42 = iimage->data;
        iVar31 = iimage->data_width;
        iVar35 = iVar31 * (iVar37 + -1);
        iVar36 = iVar31 * (iVar37 + -1 + iVar40);
        fVar57 = pfVar42[iVar36 + -1 + iVar24];
        iVar31 = iVar31 * (iVar1 + -1 + iVar37);
        fVar4 = pfVar42[iVar31 + -1 + iVar24];
        fVar5 = pfVar42[iVar31 + -1 + iVar18];
        fVar6 = pfVar42[iVar35 + -1 + iVar24];
        fVar7 = pfVar42[iVar35 + -1 + iVar18];
        fVar61 = pfVar42[iVar36 + -1 + iVar18];
        auVar43 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar35 + iVar30] - pfVar42[iVar31 + iVar30]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *(float *)((long)haarResponseX + lVar27) = (fVar4 - fVar7) + auVar43._0_4_;
        auVar43 = vfmadd213ss_fma(ZEXT416((uint)(fVar57 - fVar61)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar33 = auVar43._0_4_ - (fVar4 - fVar7);
      }
      lVar26 = lVar26 + 1;
      lVar27 = lVar27 + 4;
    } while (lVar26 != 0x18);
    iVar17 = iVar17 + 1;
    lVar20 = lVar20 + 1;
    lVar28 = lVar28 + 0x60;
  } while (lVar20 != 0x18);
LAB_0019f026:
  fVar57 = auVar69._0_4_;
  auVar68._8_4_ = 0x3effffff;
  auVar68._0_8_ = 0x3effffff3effffff;
  auVar68._12_4_ = 0x3effffff;
  auVar67._8_4_ = 0x80000000;
  auVar67._0_8_ = 0x8000000080000000;
  auVar67._12_4_ = 0x80000000;
  auVar43 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 0.5)),auVar67,0xf8);
  auVar43 = ZEXT416((uint)(fVar57 * 0.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 1.5)),auVar67,0xf8);
  auVar44 = ZEXT416((uint)(fVar57 * 1.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 2.5)),auVar67,0xf8);
  auVar45 = ZEXT416((uint)(fVar57 * 2.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 3.5)),auVar67,0xf8);
  auVar46 = ZEXT416((uint)(fVar57 * 3.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 4.5)),auVar67,0xf8);
  auVar47 = ZEXT416((uint)(fVar57 * 4.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 5.5)),auVar67,0xf8);
  auVar48 = ZEXT416((uint)(fVar57 * 5.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 6.5)),auVar67,0xf8);
  auVar49 = ZEXT416((uint)(fVar57 * 6.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 7.5)),auVar67,0xf8);
  auVar50 = ZEXT416((uint)(auVar50._0_4_ + fVar57 * 7.5));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 8.5)),auVar67,0xf8);
  auVar51 = ZEXT416((uint)(fVar57 * 8.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 9.5)),auVar67,0xf8);
  auVar52 = ZEXT416((uint)(fVar57 * 9.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 10.5)),auVar67,0xf8);
  auVar53 = ZEXT416((uint)(fVar57 * 10.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)(fVar57 * 11.5)),auVar67,0xf8);
  auVar54 = ZEXT416((uint)(fVar57 * 11.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  fVar61 = auVar45._0_4_;
  fVar57 = fVar61 + auVar44._0_4_;
  fVar2 = fVar61 + auVar43._0_4_;
  fVar3 = fVar61 - auVar43._0_4_;
  fVar4 = fVar61 - auVar44._0_4_;
  fVar5 = fVar61 - auVar46._0_4_;
  fVar6 = fVar61 - auVar47._0_4_;
  fVar7 = fVar61 - auVar48._0_4_;
  fVar61 = fVar61 - auVar49._0_4_;
  fVar66 = auVar50._0_4_;
  fVar8 = fVar66 - auVar46._0_4_;
  fVar9 = fVar66 - auVar47._0_4_;
  fVar10 = fVar66 - auVar48._0_4_;
  fVar11 = fVar66 - auVar49._0_4_;
  fVar12 = fVar66 - auVar51._0_4_;
  fVar13 = fVar66 - auVar52._0_4_;
  fVar14 = fVar66 - auVar53._0_4_;
  fVar66 = fVar66 - auVar54._0_4_;
  gauss_s1_c0[0] = expf(fVar57 * fVar57 * fVar56);
  gauss_s1_c0[1] = expf(fVar2 * fVar2 * fVar56);
  gauss_s1_c0[2] = expf(fVar3 * fVar3 * fVar56);
  gauss_s1_c0[3] = expf(fVar4 * fVar4 * fVar56);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar5 * fVar5 * fVar56);
  gauss_s1_c0[6] = expf(fVar6 * fVar6 * fVar56);
  gauss_s1_c0[7] = expf(fVar7 * fVar7 * fVar56);
  gauss_s1_c0[8] = expf(fVar61 * fVar61 * fVar56);
  gauss_s1_c1[0] = expf(fVar8 * fVar8 * fVar56);
  gauss_s1_c1[1] = expf(fVar9 * fVar9 * fVar56);
  gauss_s1_c1[2] = expf(fVar10 * fVar10 * fVar56);
  gauss_s1_c1[3] = expf(fVar11 * fVar11 * fVar56);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar12 * fVar12 * fVar56);
  gauss_s1_c1[6] = expf(fVar13 * fVar13 * fVar56);
  gauss_s1_c1[7] = expf(fVar14 * fVar14 * fVar56);
  gauss_s1_c1[8] = expf(fVar66 * fVar66 * fVar56);
  uVar21 = 0xfffffff8;
  lVar20 = 0;
  fVar57 = 0.0;
  auVar60._8_4_ = 0x7fffffff;
  auVar60._0_8_ = 0x7fffffff7fffffff;
  auVar60._12_4_ = 0x7fffffff;
  lVar28 = 0;
  lVar27 = 0;
  do {
    pfVar33 = gauss_s1_c1;
    uVar19 = (uint)uVar21;
    if (uVar19 != 7) {
      pfVar33 = gauss_s1_c0;
    }
    if (uVar19 == 0xfffffff8) {
      pfVar33 = gauss_s1_c1;
    }
    lVar28 = (long)(int)lVar28;
    iVar40 = (int)lVar27;
    lVar27 = (long)iVar40;
    lVar26 = (long)haarResponseX + lVar20;
    lVar41 = (long)haarResponseY + lVar20;
    uVar32 = 0xfffffff8;
    uVar29 = 0;
    do {
      pfVar42 = gauss_s1_c1;
      if (uVar32 != 7) {
        pfVar42 = gauss_s1_c0;
      }
      if (uVar32 == 0xfffffff8) {
        pfVar42 = gauss_s1_c1;
      }
      uVar22 = (ulong)(uVar32 >> 0x1c & 0xfffffff8);
      auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar25 = uVar29;
      lVar38 = lVar26;
      lVar39 = lVar41;
      do {
        lVar34 = 0;
        pfVar23 = (float *)((long)pfVar33 + (ulong)(uint)((int)(uVar21 >> 0x1f) << 5));
        do {
          fVar2 = pfVar42[uVar22] * *pfVar23;
          auVar43 = vinsertps_avx(ZEXT416(*(uint *)(lVar39 + lVar34 * 4)),
                                  ZEXT416(*(uint *)(lVar38 + lVar34 * 4)),0x10);
          auVar65._0_4_ = fVar2 * auVar43._0_4_;
          auVar65._4_4_ = fVar2 * auVar43._4_4_;
          auVar65._8_4_ = fVar2 * auVar43._8_4_;
          auVar65._12_4_ = fVar2 * auVar43._12_4_;
          auVar43 = vandps_avx(auVar65,auVar60);
          auVar43 = vmovlhps_avx(auVar65,auVar43);
          auVar62._0_4_ = auVar69._0_4_ + auVar43._0_4_;
          auVar62._4_4_ = auVar69._4_4_ + auVar43._4_4_;
          auVar62._8_4_ = auVar69._8_4_ + auVar43._8_4_;
          auVar62._12_4_ = auVar69._12_4_ + auVar43._12_4_;
          auVar69 = ZEXT1664(auVar62);
          pfVar23 = pfVar23 + (ulong)(~uVar19 >> 0x1f) * 2 + -1;
          lVar34 = lVar34 + 1;
        } while (lVar34 != 9);
        uVar25 = uVar25 + 0x18;
        uVar22 = uVar22 + (ulong)(-1 < (int)uVar32) * 2 + -1;
        lVar38 = lVar38 + 0x60;
        lVar39 = lVar39 + 0x60;
      } while (uVar25 < uVar32 * 0x18 + 0x198);
      fVar2 = gauss_s2_arr[lVar27];
      auVar16._4_4_ = fVar2;
      auVar16._0_4_ = fVar2;
      auVar16._8_4_ = fVar2;
      auVar16._12_4_ = fVar2;
      auVar45 = vmulps_avx512vl(auVar62,auVar16);
      lVar27 = lVar27 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar28) = auVar45;
      auVar63._0_4_ = auVar45._0_4_ * auVar45._0_4_;
      auVar63._4_4_ = auVar45._4_4_ * auVar45._4_4_;
      auVar63._8_4_ = auVar45._8_4_ * auVar45._8_4_;
      auVar63._12_4_ = auVar45._12_4_ * auVar45._12_4_;
      auVar43 = vmovshdup_avx(auVar63);
      auVar44 = vfmadd231ss_fma(auVar43,auVar45,auVar45);
      auVar43 = vshufpd_avx(auVar45,auVar45,1);
      auVar44 = vfmadd213ss_fma(auVar43,auVar43,auVar44);
      auVar43 = vshufps_avx(auVar45,auVar45,0xff);
      auVar43 = vfmadd213ss_fma(auVar43,auVar43,auVar44);
      fVar57 = fVar57 + auVar43._0_4_;
      lVar28 = lVar28 + 4;
      uVar32 = uVar32 + 5;
      uVar29 = uVar29 + 0x78;
      lVar26 = lVar26 + 0x1e0;
      lVar41 = lVar41 + 0x1e0;
    } while (iVar40 + 4 != (int)lVar27);
    lVar20 = lVar20 + 0x14;
    uVar21 = (ulong)(uVar19 + 5);
  } while ((int)uVar19 < 3);
  if (fVar57 < 0.0) {
    fVar57 = sqrtf(fVar57);
  }
  else {
    auVar43 = vsqrtss_avx(ZEXT416((uint)fVar57),ZEXT416((uint)fVar57));
    fVar57 = auVar43._0_4_;
  }
  auVar69 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar57)));
  lVar20 = 0;
  do {
    auVar55 = vmulps_avx512f(auVar69,*(undefined1 (*) [64])(ipoint->descriptor + lVar20));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar20) = auVar55;
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_1_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}